

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

LanguageBreakEngine * icu_63::getLanguageBreakEngineFromFactory(UChar32 c)

{
  long *plVar1;
  LanguageBreakFactory *factory;
  LanguageBreakEngine *lbe;
  int32_t i;
  UChar32 c_local;
  
  umtx_initOnce(&gLanguageBreakFactoriesInitOnce,initLanguageFactories);
  if (gLanguageBreakFactories == (UStack *)0x0) {
    _i = (LanguageBreakEngine *)0x0;
  }
  else {
    lbe._0_4_ = UVector::size(&gLanguageBreakFactories->super_UVector);
    factory = (LanguageBreakFactory *)0x0;
    do {
      lbe._0_4_ = (int32_t)lbe + -1;
      if ((int32_t)lbe < 0) break;
      plVar1 = (long *)UVector::elementAt(&gLanguageBreakFactories->super_UVector,(int32_t)lbe);
      factory = (LanguageBreakFactory *)(**(code **)(*plVar1 + 0x10))(plVar1,c);
    } while (factory == (LanguageBreakFactory *)0x0);
    _i = (LanguageBreakEngine *)factory;
  }
  return _i;
}

Assistant:

static const LanguageBreakEngine*
getLanguageBreakEngineFromFactory(UChar32 c)
{
    umtx_initOnce(gLanguageBreakFactoriesInitOnce, &initLanguageFactories);
    if (gLanguageBreakFactories == NULL) {
        return NULL;
    }

    int32_t i = gLanguageBreakFactories->size();
    const LanguageBreakEngine *lbe = NULL;
    while (--i >= 0) {
        LanguageBreakFactory *factory = (LanguageBreakFactory *)(gLanguageBreakFactories->elementAt(i));
        lbe = factory->getEngineFor(c);
        if (lbe != NULL) {
            break;
        }
    }
    return lbe;
}